

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

bool xatlas::internal::Fit::computeLeastSquaresNormal
               (Vector3 *points,uint32_t pointsCount,Vector3 *normal)

{
  bool bVar1;
  float f;
  Vector3 VVar2;
  undefined8 local_158;
  float local_150;
  float fStack_134;
  float len;
  float local_12c;
  Vector3 local_128;
  Vector3 local_11c;
  undefined1 local_110 [8];
  Vector3 dir;
  float local_fc;
  float det_max;
  float det_z;
  float det_y;
  float det_x;
  float local_e8;
  undefined8 local_dc;
  Vector3 r;
  uint32_t i_1;
  float zz;
  float yz;
  float yy;
  float xz;
  float xy;
  float xx;
  uint32_t i;
  Vector3 centroid;
  float invN;
  float local_98;
  Vector3 local_90;
  Vector3 local_80;
  Vector3 local_70;
  Vector3 local_60;
  Vector3 local_50;
  Vector3 local_40 [2];
  Vector3 *local_28;
  Vector3 *normal_local;
  Vector3 *pVStack_18;
  uint32_t pointsCount_local;
  Vector3 *points_local;
  
  local_28 = normal;
  normal_local._4_4_ = (float)pointsCount;
  pVStack_18 = points;
  if (pointsCount < 3) {
    __assert_fail("pointsCount >= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x66c,
                  "static bool xatlas::internal::Fit::computeLeastSquaresNormal(const Vector3 *, uint32_t, Vector3 *)"
                 );
  }
  if (pointsCount == 3) {
    VVar2 = operator-(points + 2,points);
    local_60.z = VVar2.z;
    local_50.z = local_60.z;
    local_60._0_8_ = VVar2._0_8_;
    local_50.x = local_60.x;
    local_50.y = local_60.y;
    local_60 = VVar2;
    VVar2 = operator-(pVStack_18 + 1,pVStack_18);
    local_80.z = VVar2.z;
    local_70.z = local_80.z;
    local_80._0_8_ = VVar2._0_8_;
    local_70.x = local_80.x;
    local_70.y = local_80.y;
    VVar2 = cross(&local_50,&local_70);
    local_90.z = VVar2.z;
    local_40[0].z = local_90.z;
    local_90._0_8_ = VVar2._0_8_;
    local_40[0].x = local_90.x;
    local_40[0].y = local_90.y;
    VVar2 = normalize(local_40,0.0001);
    stack0xffffffffffffff60 = VVar2._0_8_;
    local_98 = VVar2.z;
    local_28->x = centroid.z;
    local_28->y = invN;
    local_28->z = local_98;
    points_local._7_1_ = true;
  }
  else {
    centroid.y = 1.0 / (float)pointsCount;
    Vector3::Vector3((Vector3 *)&xx,0.0);
    for (xy = 0.0; (uint)xy < (uint)normal_local._4_4_; xy = (float)((int)xy + 1)) {
      Vector3::operator+=((Vector3 *)&xx,pVStack_18 + (uint)xy);
    }
    Vector3::operator*=((Vector3 *)&xx,centroid.y);
    xz = 0.0;
    yy = 0.0;
    yz = 0.0;
    zz = 0.0;
    i_1 = 0;
    r.z = 0.0;
    for (r.y = 0.0; (uint)r.y < (uint)normal_local._4_4_; r.y = (float)((int)r.y + 1)) {
      _det_y = operator-(pVStack_18 + (uint)r.y,(Vector3 *)&xx);
      r.x = local_e8;
      local_dc._0_4_ = det_y;
      xz = (float)local_dc * (float)local_dc + xz;
      local_dc._4_4_ = det_y._4_4_;
      yy = (float)local_dc * local_dc._4_4_ + yy;
      yz = (float)local_dc * local_e8 + yz;
      zz = local_dc._4_4_ * local_dc._4_4_ + zz;
      i_1 = (uint32_t)(local_dc._4_4_ * local_e8 + (float)i_1);
      r.z = local_e8 * local_e8 + r.z;
      local_dc = _det_y;
    }
    det_z = zz * r.z + -((float)i_1 * (float)i_1);
    det_max = xz * r.z + -(yz * yz);
    local_fc = xz * zz + -(yy * yy);
    dir.y = max<float>(&det_max,&local_fc);
    dir.z = max<float>(&det_z,&dir.y);
    if (0.0 < dir.z) {
      Vector3::Vector3((Vector3 *)local_110,0.0);
      if ((dir.z != det_z) || (NAN(dir.z) || NAN(det_z))) {
        if ((dir.z != det_max) || (NAN(dir.z) || NAN(det_max))) {
          if ((dir.z == local_fc) && (!NAN(dir.z) && !NAN(local_fc))) {
            Vector3::Vector3((Vector3 *)&stack0xfffffffffffffecc,yy * (float)i_1 + -(yz * zz),
                             yy * yz + -((float)i_1 * xz),local_fc);
            local_110._0_4_ = fStack_134;
            local_110._4_4_ = len;
            dir.x = local_12c;
          }
        }
        else {
          Vector3::Vector3(&local_128,yz * (float)i_1 + -(yy * r.z),det_max,
                           yy * yz + -((float)i_1 * xz));
          local_110._0_4_ = local_128.x;
          local_110._4_4_ = local_128.y;
          dir.x = local_128.z;
        }
      }
      else {
        Vector3::Vector3(&local_11c,det_z,yz * (float)i_1 + -(yy * r.z),yy * (float)i_1 + -(yz * zz)
                        );
        local_110._0_4_ = local_11c.x;
        local_110._4_4_ = local_11c.y;
        dir.x = local_11c.z;
      }
      f = internal::length((Vector3 *)local_110);
      bVar1 = isZero(f,0.0001);
      if (bVar1) {
        points_local._7_1_ = false;
      }
      else {
        VVar2 = operator*((Vector3 *)local_110,1.0 / f);
        local_158 = VVar2._0_8_;
        local_150 = VVar2.z;
        local_28->x = (float)(undefined4)local_158;
        local_28->y = (float)local_158._4_4_;
        local_28->z = local_150;
        points_local._7_1_ = isNormalized(local_28,0.001);
      }
    }
    else {
      points_local._7_1_ = false;
    }
  }
  return points_local._7_1_;
}

Assistant:

static bool computeLeastSquaresNormal(const Vector3 *points, uint32_t pointsCount, Vector3 *normal)
	{
		XA_DEBUG_ASSERT(pointsCount >= 3);
		if (pointsCount == 3) {
			*normal = normalize(cross(points[2] - points[0], points[1] - points[0]), kEpsilon);
			return true;
		}
		const float invN = 1.0f / float(pointsCount);
		Vector3 centroid(0.0f);
		for (uint32_t i = 0; i < pointsCount; i++)
			centroid += points[i];
		centroid *= invN;
		// Calculate full 3x3 covariance matrix, excluding symmetries:
		float xx = 0.0f, xy = 0.0f, xz = 0.0f, yy = 0.0f, yz = 0.0f, zz = 0.0f;
		for (uint32_t i = 0; i < pointsCount; i++) {
			Vector3 r = points[i] - centroid;
			xx += r.x * r.x;
			xy += r.x * r.y;
			xz += r.x * r.z;
			yy += r.y * r.y;
			yz += r.y * r.z;
			zz += r.z * r.z;
		}
#if 0
		xx *= invN;
		xy *= invN;
		xz *= invN;
		yy *= invN;
		yz *= invN;
		zz *= invN;
		Vector3 weighted_dir(0.0f);
		{
			float det_x = yy * zz - yz * yz;
			const Vector3 axis_dir(det_x, xz * yz - xy * zz, xy * yz - xz * yy);
			float weight = det_x * det_x;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		{
			float det_y = xx * zz - xz * xz;
			const Vector3 axis_dir(xz * yz - xy * zz, det_y, xy * xz - yz * xx);
			float weight = det_y * det_y;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		{
			float det_z = xx * yy - xy * xy;
			const Vector3 axis_dir(xy * yz - xz * yy, xy * xz - yz * xx, det_z);
			float weight = det_z * det_z;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		*normal = normalize(weighted_dir, kEpsilon);
#else
		const float det_x = yy * zz - yz * yz;
		const float det_y = xx * zz - xz * xz;
		const float det_z = xx * yy - xy * xy;
		const float det_max = max(det_x, max(det_y, det_z));
		if (det_max <= 0.0f)
			return false; // The points don't span a plane
		// Pick path with best conditioning:
		Vector3 dir(0.0f);
		if (det_max == det_x)
			dir = Vector3(det_x,xz * yz - xy * zz,xy * yz - xz * yy);
		else if (det_max == det_y)
			dir = Vector3(xz * yz - xy * zz, det_y, xy * xz - yz * xx);
		else if (det_max == det_z)
			dir = Vector3(xy * yz - xz * yy, xy * xz - yz * xx, det_z);
		const float len = length(dir);
		if (isZero(len, kEpsilon))
			return false;
		*normal = dir * (1.0f / len);
#endif
		return isNormalized(*normal);
	}